

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTrace.c
# Opt level: O2

void Sat_SolverTraceWrite(sat_solver *pSat,int *pBeg,int *pEnd,int fRoot)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  
  if (pSat->pFile != (FILE *)0x0) {
    uVar1 = pSat->nClauses;
    uVar2 = pSat->nRoots;
    pSat->nClauses = uVar1 + 1;
    pSat->nRoots = fRoot + uVar2;
    for (; pBeg < pEnd; pBeg = (int *)((uint *)pBeg + 1)) {
      uVar4 = *pBeg >> 1;
      uVar3 = ~uVar4;
      if ((*pBeg & 1U) == 0) {
        uVar3 = uVar4 + 1;
      }
      fprintf((FILE *)pSat->pFile," %d",(ulong)uVar3);
    }
    fwrite(" 0\n",3,1,(FILE *)pSat->pFile);
    return;
  }
  return;
}

Assistant:

void Sat_SolverTraceWrite( sat_solver * pSat, int * pBeg, int * pEnd, int fRoot )
{
    if ( pSat->pFile == NULL )
        return;
    pSat->nClauses++;
    pSat->nRoots += fRoot;
    for ( ; pBeg < pEnd ; pBeg++ )
        fprintf( pSat->pFile, " %d", lit_print(*pBeg) );
    fprintf( pSat->pFile, " 0\n" );
}